

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O1

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append
          (ON_SubDComponentRefList *this,ON_SubDRef *subd_ref,ON_COMPONENT_INDEX ci,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubDComponentPtr component_ptr;
  ON_SubD *pOVar2;
  ON_SubDComponentRef *pOVar3;
  ON_SubDComponentRef r;
  ON_COMPONENT_INDEX local_70;
  ON_SubDComponentRef local_68;
  
  pOVar2 = (subd_ref->m_subd_sp).super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar2 == (element_type *)0x0) {
    pOVar2 = &ON_SubD::Empty;
  }
  local_70 = ci;
  bVar1 = ON_SubD::IsEmpty(pOVar2);
  pOVar3 = &ON_SubDComponentRef::Empty;
  if (!bVar1) {
    bVar1 = ON_COMPONENT_INDEX::IsSubDComponentIndex(&local_70);
    if (bVar1) {
      pOVar2 = (subd_ref->m_subd_sp).super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pOVar2 == (element_type *)0x0) {
        pOVar2 = &ON_SubD::Empty;
      }
      component_ptr = ON_SubD::ComponentPtrFromComponentIndex(pOVar2,local_70);
      ON_SubDComponentRef::Create(&local_68,subd_ref,component_ptr,component_location,reference_id);
      pOVar3 = Append(this,&local_68);
      local_68.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
           (_func_int **)&PTR_ClassId_00829458;
      ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
      ON_Object::~ON_Object((ON_Object *)&local_68);
    }
  }
  return pOVar3;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(
  const ON_SubDRef & subd_ref,
  ON_COMPONENT_INDEX ci, 
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
  )
{
  for (;;)
  {
    if (subd_ref.SubD().IsEmpty())
      break;
    if (false == ci.IsSubDComponentIndex())
      break;
    const ON_SubDComponentRef r(ON_SubDComponentRef::Create(subd_ref, ci, component_location, reference_id));
    return Append(&r);
  }
  return ON_SubDComponentRef::Empty;
}